

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofiletobin.cpp
# Opt level: O0

void fmprofiletobin::doit(bool step)

{
  int iVar1;
  char *pcVar2;
  uint local_105c;
  char local_1058 [4];
  int lineno;
  char line [4096];
  undefined1 local_49 [8];
  fm_profile q;
  bool step_local;
  
  q.share2._0_1_ = step;
  if (step) {
    dostep();
  }
  else {
    fm_profile::fm_profile((fm_profile *)local_49);
    fgets(local_1058,0x1000,_stdin);
    local_105c = 1;
    while (pcVar2 = fgets(local_1058,0x1000,_stdin), pcVar2 != (char *)0x0) {
      iVar1 = __isoc99_sscanf(local_1058,"%d,%d,%f,%f,%f,%f,%f,%f,%f,%f",local_49,local_49 + 4,&q,
                              &q.calcrule_id,&q.deductible1,&q.deductible2,&q.deductible3,
                              &q.attachment,&q.limit,&q.share1);
      if (iVar1 != 10) {
        fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)local_105c,local_1058);
        return;
      }
      fwrite(local_49,0x28,1,_stdout);
      local_105c = local_105c + 1;
    }
  }
  return;
}

Assistant:

void doit(bool step) {
		if (step) {
			dostep();
			return;
		}
        fm_profile q;
        char line[4096];
        int lineno = 0;
        fgets(line, sizeof(line), stdin);  // skip header
        lineno++;
        while (fgets(line, sizeof(line), stdin) != 0) {
#ifdef OASIS_FLOAT_TYPE_DOUBLE
            if (sscanf(line, "%d,%d,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf", &q.profile_id,
                       &q.calcrule_id, &q.deductible1, &q.deductible2,
                       &q.deductible3, &q.attachment, &q.limit, &q.share1,
                       &q.share2, &q.share3) != 10) {
#else
            if (sscanf(line, "%d,%d,%f,%f,%f,%f,%f,%f,%f,%f", &q.profile_id,
                       &q.calcrule_id, &q.deductible1, &q.deductible2,
                       &q.deductible3, &q.attachment, &q.limit, &q.share1,
                       &q.share2, &q.share3) != 10) {
#endif
                fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
                return;
            } else {
                fwrite(&q, sizeof(q), 1, stdout);
            }
            lineno++;
        }
    }

}